

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerException.cpp
# Opt level: O0

string * ninx::lexer::exception::LexerException::make_message
                   (string *__return_storage_ptr__,int line,string *origin,string *message)

{
  ostream *poVar1;
  stringstream local_1b0 [8];
  stringstream s;
  ostream local_1a0 [376];
  string *local_28;
  string *message_local;
  string *origin_local;
  string *psStack_10;
  int line_local;
  
  local_28 = message;
  message_local = origin;
  origin_local._4_4_ = line;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"LexerError at line: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,origin_local._4_4_);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,(string *)local_28);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_1a0,"\tfrom origin: ");
  std::operator<<(poVar1,(string *)message_local);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string
ninx::lexer::exception::LexerException::make_message(int line, const std::string &origin, const std::string &message) {
    std::stringstream s;
    s << "LexerError at line: " << line << ", " << message << std::endl;
    s << "\tfrom origin: " << origin;
    return s.str();
}